

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabColumnMethod(sqlite3_vtab_cursor *pCursor,sqlite3_context *pCtx,int iCol)

{
  int iVar1;
  int iVar2;
  Mem *pMVar3;
  sqlite3_vtab *psVar4;
  _func_int_sqlite3_vtab_ptr *p_Var5;
  ulong uVar6;
  uint uVar7;
  sqlite3_module *psVar8;
  
  if (iCol == 0) {
    setResultStrOrError(pCtx,(char *)pCursor[0xb].pVtab,*(int *)&pCursor[0xc].pVtab,'\x01',
                        (_func_void_void_ptr *)0xffffffffffffffff);
    goto LAB_001b2a09;
  }
  iVar1 = pCursor->pVtab[2].nRef;
  if (iVar1 == 1) {
    if (iCol == 1) {
      psVar4 = pCursor[9].pVtab;
    }
    else {
      psVar4 = pCursor[8].pVtab;
    }
    psVar8 = psVar4->pModule;
    goto LAB_001b2ac4;
  }
  psVar8 = pCursor[2].pVtab[1].pModule;
  iVar2 = *(int *)((long)&psVar8->xColumn + 4);
  if (iVar1 == 0) {
    if (iCol == 2) {
      psVar4 = pCursor[9].pVtab;
    }
    else {
      if (iCol == 1) {
        if (iVar2 == 1) goto LAB_001b2a09;
        p_Var5 = psVar8->xDisconnect;
        uVar6 = (ulong)*(int *)&pCursor[7].pVtab;
LAB_001b2aa8:
        psVar8 = (sqlite3_module *)0x0;
        setResultStrOrError(pCtx,*(char **)(p_Var5 + uVar6 * 8),-1,'\x01',(_func_void_void_ptr *)0x0
                           );
        goto LAB_001b2ac4;
      }
      psVar4 = pCursor[8].pVtab;
    }
    psVar8 = (&psVar4->pModule)[*(int *)&pCursor[7].pVtab];
    goto LAB_001b2ac4;
  }
  if (iCol == 2) {
    if (iVar2 == 2) {
      uVar7 = *(uint *)&pCursor[0xd].pVtab;
    }
    else {
      uVar7 = 0xffffffff;
      if (iVar2 == 0) {
        uVar7 = *(uint *)((long)&pCursor[0xd].pVtab + 4);
      }
    }
    if ((-1 < (int)uVar7) && ((int)uVar7 < *(int *)&psVar8->xBestIndex)) {
      p_Var5 = psVar8->xDisconnect;
      uVar6 = (ulong)uVar7;
      goto LAB_001b2aa8;
    }
  }
  else {
    if (iCol == 1) {
      psVar8 = (pCursor[4].pVtab)->pModule;
    }
    else {
      if (iVar2 != 0) goto LAB_001b2a09;
      psVar8 = (sqlite3_module *)(ulong)((uint)pCursor[0xd].pVtab & 0x7fffffff);
    }
    pMVar3 = pCtx->pOut;
    if ((pMVar3->flags & 0x2400) == 0) {
      (pMVar3->u).i = (i64)psVar8;
      pMVar3->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMVar3,(i64)psVar8);
    }
  }
LAB_001b2a09:
  psVar8 = (sqlite3_module *)0x0;
LAB_001b2ac4:
  if (0 < (long)psVar8) {
    pMVar3 = pCtx->pOut;
    if ((pMVar3->flags & 0x2400) == 0) {
      (pMVar3->u).i = (i64)psVar8;
      pMVar3->flags = 4;
    }
    else {
      vdbeReleaseAndSetInt64(pMVar3,(i64)psVar8);
    }
  }
  return 0;
}

Assistant:

static int fts5VocabColumnMethod(
  sqlite3_vtab_cursor *pCursor,   /* Cursor to retrieve value from */
  sqlite3_context *pCtx,          /* Context for sqlite3_result_xxx() calls */
  int iCol                        /* Index of column to read value from */
){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eDetail = pCsr->pFts5->pConfig->eDetail;
  int eType = ((Fts5VocabTable*)(pCursor->pVtab))->eType;
  i64 iVal = 0;

  if( iCol==0 ){
    sqlite3_result_text(
        pCtx, (const char*)pCsr->term.p, pCsr->term.n, SQLITE_TRANSIENT
    );
  }else if( eType==FTS5_VOCAB_COL ){
    assert( iCol==1 || iCol==2 || iCol==3 );
    if( iCol==1 ){
      if( eDetail!=FTS5_DETAIL_NONE ){
        const char *z = pCsr->pFts5->pConfig->azCol[pCsr->iCol];
        sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
      }
    }else if( iCol==2 ){
      iVal = pCsr->aDoc[pCsr->iCol];
    }else{
      iVal = pCsr->aCnt[pCsr->iCol];
    }
  }else if( eType==FTS5_VOCAB_ROW ){
    assert( iCol==1 || iCol==2 );
    if( iCol==1 ){
      iVal = pCsr->aDoc[0];
    }else{
      iVal = pCsr->aCnt[0];
    }
  }else{
    assert( eType==FTS5_VOCAB_INSTANCE );
    switch( iCol ){
      case 1:
        sqlite3_result_int64(pCtx, pCsr->pIter->iRowid);
        break;
      case 2: {
        int ii = -1;
        if( eDetail==FTS5_DETAIL_FULL ){
          ii = FTS5_POS2COLUMN(pCsr->iInstPos);
        }else if( eDetail==FTS5_DETAIL_COLUMNS ){
          ii = (int)pCsr->iInstPos;
        }
        if( ii>=0 && ii<pCsr->pFts5->pConfig->nCol ){
          const char *z = pCsr->pFts5->pConfig->azCol[ii];
          sqlite3_result_text(pCtx, z, -1, SQLITE_STATIC);
        }
        break;
      }
      default: {
        assert( iCol==3 );
        if( eDetail==FTS5_DETAIL_FULL ){
          int ii = FTS5_POS2OFFSET(pCsr->iInstPos);
          sqlite3_result_int(pCtx, ii);
        }
        break;
      }
    }
  }

  if( iVal>0 ) sqlite3_result_int64(pCtx, iVal);
  return SQLITE_OK;
}